

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

void __thiscall JFSON::anon_unknown_22::JsonParser::consume_garbage(JsonParser *this)

{
  char *pcVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  long local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar2 = (this->str->_M_dataplus)._M_p;
  sVar5 = this->i;
  while( true ) {
    uVar4 = (ulong)(byte)pcVar2[sVar5];
    if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
    this->i = sVar5 + 1;
    sVar5 = sVar5 + 1;
  }
  if (this->strategy == COMMENTS) {
    do {
      sVar5 = this->i;
      pcVar2 = (this->str->_M_dataplus)._M_p;
      bVar6 = pcVar2[sVar5] == '/';
      if (bVar6) {
        uVar4 = sVar5 + 1;
        this->i = uVar4;
        uVar3 = this->str->_M_string_length;
        local_48 = local_38;
        if (uVar4 == uVar3) {
          local_50 = 0x2e;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          *local_48 = 0x7463657078656e75;
          local_48[1] = 0x6f20646e65206465;
          local_48[2] = 0x207475706e692066;
          local_48[3] = 0x7473207265746661;
          builtin_strncpy((char *)((long)local_48 + 0x1e),"start of",8);
          builtin_strncpy((char *)((long)local_48 + 0x26)," comment",8);
          local_38[0] = local_50;
        }
        else if (pcVar2[uVar4] == '*') {
          uVar4 = sVar5 + 2;
          this->i = uVar4;
          while (uVar4 <= uVar3 - 2) {
            if ((pcVar2[uVar4] == '*') && (pcVar2[uVar4 + 1] == '/')) {
              this->i = uVar4 + 2;
              bVar6 = true;
              goto LAB_00106002;
            }
            uVar4 = uVar4 + 1;
            this->i = uVar4;
          }
          local_50 = 0x31;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          *local_48 = 0x7463657078656e75;
          local_48[1] = 0x6f20646e65206465;
          local_48[2] = 0x207475706e692066;
          local_48[3] = 0x6d20656469736e69;
          local_48[4] = 0x6e696c2d69746c75;
          local_48[5] = 0x6e656d6d6f632065;
          *(char *)(local_48 + 6) = 't';
          local_38[0] = local_50;
        }
        else {
          if (pcVar2[uVar4] == '/') {
            uVar4 = sVar5 + 2;
            do {
              this->i = uVar4;
              bVar6 = true;
              if (uVar3 <= uVar4) break;
              pcVar1 = pcVar2 + uVar4;
              uVar4 = uVar4 + 1;
            } while (*pcVar1 != '\n');
            goto LAB_00106002;
          }
          local_50 = 0x11;
          local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
          local_38[0] = local_50;
          *local_48 = 0x656d726f666c616d;
          local_48[1] = 0x6e656d6d6f632064;
          *(char *)(local_48 + 2) = 't';
        }
        *(char *)((long)local_48 + local_38[0]) = '\0';
        local_50 = local_38[0];
        local_40 = local_38[0];
        if (this->failed == false) {
          std::__cxx11::string::operator=((string *)this->err,(string *)&local_48);
        }
        this->failed = true;
        if (local_48 != local_38) {
          operator_delete(local_48);
        }
        bVar6 = false;
      }
LAB_00106002:
      if (this->failed != false) {
        return;
      }
      pcVar2 = (this->str->_M_dataplus)._M_p;
      sVar5 = this->i;
      while( true ) {
        uVar4 = (ulong)(byte)pcVar2[sVar5];
        if ((0x20 < uVar4) || ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0)) break;
        this->i = sVar5 + 1;
        sVar5 = sVar5 + 1;
      }
    } while (bVar6);
  }
  return;
}

Assistant:

void consume_garbage() {
      consume_whitespace();
      if(strategy == JsonParse::COMMENTS) {
        bool comment_found = false;
        do {
          comment_found = consume_comment();
          if (failed) return;
          consume_whitespace();
        }
        while(comment_found);
      }
    }